

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

nodes_slot __thiscall
libtorrent::anon_unknown_70::write_nodes
          (anon_unknown_70 *this,stack_allocator *alloc,
          vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
          *nodes)

{
  pointer ppVar1;
  size_t sVar2;
  allocation_slot idx;
  allocation_slot idx_00;
  pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_> *n;
  pointer ppVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  int iVar5;
  char **out;
  int iVar6;
  pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_> *n_1;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  *__range2;
  bool bVar7;
  nodes_slot nVar8;
  char *v6_ptr;
  char *v4_ptr;
  size_t *local_78;
  size_t local_70;
  size_t local_68 [2];
  size_t local_58;
  char *local_50;
  char *local_48;
  int local_40;
  int local_3c;
  _Tuple_impl<2UL,_int,_libtorrent::aux::allocation_slot> local_38;
  
  ppVar3 = (nodes->
           super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (nodes->
           super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 == ppVar1) {
    iVar5 = 0;
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    iVar5 = 0;
    do {
      bVar7 = (ppVar3->second).impl_.data_.base.sa_family == 2;
      iVar5 = iVar5 + (uint)!bVar7;
      iVar6 = iVar6 + (uint)bVar7;
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar1);
  }
  local_38 = (_Tuple_impl<2UL,_int,_libtorrent::aux::allocation_slot>)this;
  idx = aux::stack_allocator::allocate(alloc,iVar6 * 0x1a);
  idx_00 = aux::stack_allocator::allocate(alloc,iVar5 * 0x26);
  local_3c = idx.m_idx;
  local_48 = aux::stack_allocator::ptr(alloc,idx);
  local_40 = idx_00.m_idx;
  local_50 = aux::stack_allocator::ptr(alloc,idx_00);
  ppVar3 = (nodes->
           super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (nodes->
           super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = extraout_RDX;
  if (ppVar3 != ppVar1) {
    do {
      local_78 = local_68;
      if ((ppVar3->second).impl_.data_.base.sa_family == 2) {
        local_58 = 0x14;
        local_78 = (size_t *)::std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_58);
        local_68[0] = local_58;
        *(uint *)(local_78 + 2) = (ppVar3->first).m_number._M_elems[4];
        sVar2 = *(size_t *)((ppVar3->first).m_number._M_elems + 2);
        *local_78 = *(size_t *)(ppVar3->first).m_number._M_elems;
        local_78[1] = sVar2;
        local_70 = local_58;
        *(undefined1 *)((long)local_78 + local_58) = 0;
        memcpy(local_48,local_78,local_58);
        local_48 = local_48 + local_70;
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        out = &local_48;
      }
      else {
        local_58 = 0x14;
        local_78 = (size_t *)::std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_58);
        local_68[0] = local_58;
        *(uint *)(local_78 + 2) = (ppVar3->first).m_number._M_elems[4];
        sVar2 = *(size_t *)((ppVar3->first).m_number._M_elems + 2);
        *local_78 = *(size_t *)(ppVar3->first).m_number._M_elems;
        local_78[1] = sVar2;
        local_70 = local_58;
        *(undefined1 *)((long)local_78 + local_58) = 0;
        memcpy(local_50,local_78,local_58);
        local_50 = local_50 + local_70;
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        out = &local_50;
      }
      aux::write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char*&>
                (&ppVar3->second,out);
      ppVar3 = ppVar3 + 1;
      uVar4 = extraout_RDX_00;
    } while (ppVar3 != ppVar1);
  }
  *(int *)local_38 = local_40;
  *(int *)((long)local_38 + 4) = iVar5;
  *(int *)((long)local_38 + 8) = local_3c;
  *(int *)((long)local_38 + 0xc) = iVar6;
  nVar8.
  super__Tuple_impl<0UL,_int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>
  .super__Tuple_impl<1UL,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>.
  super__Head_base<1UL,_libtorrent::aux::allocation_slot,_false>._M_head_impl.m_idx =
       (allocation_slot)(allocation_slot)(int)uVar4;
  nVar8.
  super__Tuple_impl<0UL,_int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>
  .super__Head_base<0UL,_int,_false>._M_head_impl = (int)((ulong)uVar4 >> 0x20);
  nVar8.
  super__Tuple_impl<0UL,_int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>
  .super__Tuple_impl<1UL,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>.
  super__Tuple_impl<2UL,_int,_libtorrent::aux::allocation_slot> = local_38;
  return (nodes_slot)
         nVar8.
         super__Tuple_impl<0UL,_int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>
  ;
}

Assistant:

nodes_slot write_nodes(aux::stack_allocator& alloc
		, std::vector<std::pair<sha1_hash, udp::endpoint>> const& nodes)
	{
		int v4_num_nodes = 0;
		int v6_num_nodes = 0;

		for (auto const& n : nodes)
		{
			if (aux::is_v4(n.second))
				v4_num_nodes++;
			else
				v6_num_nodes++;
		}

		aux::allocation_slot const v4_nodes_idx = alloc.allocate(v4_num_nodes * (20 + 6));
		aux::allocation_slot const v6_nodes_idx = alloc.allocate(v6_num_nodes * (20 + 18));

		char* v4_ptr = alloc.ptr(v4_nodes_idx);
		char* v6_ptr = alloc.ptr(v6_nodes_idx);
		for (auto const& n : nodes)
		{
			udp::endpoint const& endp = n.second;
			if (aux::is_v4(endp))
			{
				aux::write_string(n.first.to_string(), v4_ptr);
				aux::write_endpoint(endp, v4_ptr);
			}
			else
			{
				aux::write_string(n.first.to_string(), v6_ptr);
				aux::write_endpoint(endp, v6_ptr);
			}
		}

		return nodes_slot{v4_num_nodes, v4_nodes_idx, v6_num_nodes, v6_nodes_idx};
	}